

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS ref_geom_tri_supported(REF_GEOM ref_geom,REF_INT *nodes,REF_BOOL *has_support)

{
  uint uVar1;
  REF_INT geom;
  REF_INT local_14;
  
  *has_support = 0;
  uVar1 = ref_geom_find(ref_geom,*nodes,2,nodes[3],&local_14);
  if (uVar1 == 0) {
    *has_support = 1;
  }
  else {
    if (uVar1 != 5) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x1b6,
             "ref_geom_tri_supported",(ulong)uVar1,"error testing geom support");
      return uVar1;
    }
    *has_support = 0;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_geom_tri_supported(REF_GEOM ref_geom, REF_INT *nodes,
                                          REF_BOOL *has_support) {
  REF_INT node, id, geom;
  REF_STATUS status;
  *has_support = REF_FALSE;

  node = nodes[0];
  id = nodes[3];
  status = ref_geom_find(ref_geom, node, REF_GEOM_FACE, id, &geom);
  if (REF_NOT_FOUND == status) { /* no geom support */
    *has_support = REF_FALSE;
    return REF_SUCCESS;
  }
  RSS(status, "error testing geom support");
  *has_support = REF_TRUE;
  return REF_SUCCESS;
}